

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

void __thiscall CTcCodeStream::add_local_frame(CTcCodeStream *this,CTcPrsSymtab *symtab)

{
  int iVar1;
  CTcPrsSymtab *pCVar2;
  CTcPrsSymtab *in_RSI;
  long in_RDI;
  
  pCVar2 = CTcParser::get_global_symtab(G_prs);
  if (((in_RSI != pCVar2) && (in_RSI != (CTcPrsSymtab *)0x0)) &&
     (iVar1 = CTcPrsSymtab::get_list_index(in_RSI), iVar1 == 0)) {
    CTcPrsSymtab::set_list_next(in_RSI,(CTcPrsSymtab *)0x0);
    if (*(long *)(in_RDI + 0xd8) == 0) {
      *(CTcPrsSymtab **)(in_RDI + 0xd0) = in_RSI;
    }
    else {
      CTcPrsSymtab::set_list_next(*(CTcPrsSymtab **)(in_RDI + 0xd8),in_RSI);
    }
    *(CTcPrsSymtab **)(in_RDI + 0xd8) = in_RSI;
    *(long *)(in_RDI + 0xe0) = *(long *)(in_RDI + 0xe0) + 1;
    CTcPrsSymtab::set_list_index(in_RSI,(int)*(undefined8 *)(in_RDI + 0xe0));
  }
  return;
}

Assistant:

void CTcCodeStream::add_local_frame(CTcPrsSymtab *symtab)
{
    /* 
     *   If this is the global symbol table, or it's null, or it's already
     *   in a list, ignore it.  Note that we can tell if the item is in a
     *   list by checking its index value - a value of zero is never a
     *   valid index and thus indicates that the item isn't in a list yet.
     */
    if (symtab == G_prs->get_global_symtab()
        || symtab == 0
        || symtab->get_list_index() != 0)
        return;
    
    /* link the frame in at the tail of our list */
    symtab->set_list_next(0);
    if (frame_tail_ == 0)
        frame_head_ = symtab;
    else
        frame_tail_->set_list_next(symtab);
    frame_tail_ = symtab;

    /* count the new entry in the list */
    ++frame_cnt_;

    /* 
     *   Set this frame's index in the list.  Note that we've already
     *   incremented the index value, so the first frame in the list will
     *   have index 1, as is required. 
     */
    symtab->set_list_index(frame_cnt_);
}